

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O3

bool __thiscall
Memory::InlineCacheAllocator::CacheHasDeadWeakRefs
          (InlineCacheAllocator *this,Recycler *recycler,CacheLayout *cache)

{
  intptr_t *piVar1;
  ulong uVar2;
  bool bVar3;
  intptr_t *curWeakRefPtr;
  
  piVar1 = &cache->strongRef;
  while ((uVar2 = cache->weakRefs[0], (uVar2 & 0xb) != 0 || uVar2 == 0 ||
         (bVar3 = HeapBlockMap64::IsMarked
                            (&recycler->heapBlockMap,(void *)(uVar2 & 0xfffffffffffffff0)), bVar3)))
  {
    cache = (CacheLayout *)(cache->weakRefs + 1);
    if (piVar1 <= cache) {
      return false;
    }
  }
  return true;
}

Assistant:

bool InlineCacheAllocator::CacheHasDeadWeakRefs(Recycler* recycler, CacheLayout* cache)
{
    for (intptr_t* curWeakRefPtr = cache->weakRefs; curWeakRefPtr < &cache->strongRef; curWeakRefPtr++)
    {
        intptr_t curWeakRef = *curWeakRefPtr;

        if (curWeakRef == 0)
        {
            continue;
        }

        curWeakRef &= ~(intptr_t)InlineCacheAuxSlotTypeTag;

        if ((curWeakRef & (HeapConstants::ObjectGranularity - 1)) != 0)
        {
            continue;
        }


        if (!recycler->IsObjectMarked((void*)curWeakRef))
        {
            return true;
        }
    }

    return false;
}